

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseAST.cpp
# Opt level: O0

vector<antlr::ASTRefCount<antlr::AST>,_std::allocator<antlr::ASTRefCount<antlr::AST>_>_> *
__thiscall antlr::BaseAST::findAllPartial(BaseAST *this,RefAST *target)

{
  AST *pAVar1;
  ASTRefCount *in_RDX;
  ASTRefCount<antlr::AST> *in_RSI;
  vector<antlr::ASTRefCount<antlr::AST>,_std::allocator<antlr::ASTRefCount<antlr::AST>_>_> *in_RDI;
  vector<antlr::ASTRefCount<antlr::AST>,_std::allocator<antlr::ASTRefCount<antlr::AST>_>_> *roots;
  vector<antlr::ASTRefCount<antlr::AST>,_std::allocator<antlr::ASTRefCount<antlr::AST>_>_>
  *in_stack_00000068;
  BaseAST *in_stack_00000070;
  
  std::vector<antlr::ASTRefCount<antlr::AST>,_std::allocator<antlr::ASTRefCount<antlr::AST>_>_>::
  vector((vector<antlr::ASTRefCount<antlr::AST>,_std::allocator<antlr::ASTRefCount<antlr::AST>_>_> *
         )0x215bf9);
  pAVar1 = ASTRefCount::operator_cast_to_AST_(in_RDX);
  if (pAVar1 != (AST *)0x0) {
    ASTRefCount<antlr::AST>::ASTRefCount(in_RSI,(ASTRefCount<antlr::AST> *)in_RDI);
    doWorkForFindAll(in_stack_00000070,in_stack_00000068,(RefAST *)roots,this._7_1_);
    ASTRefCount<antlr::AST>::~ASTRefCount(in_RSI);
  }
  return in_RDI;
}

Assistant:

vector<RefAST> BaseAST::findAllPartial(RefAST target)
{
	ANTLR_USE_NAMESPACE(std)vector<RefAST> roots;

	// the empty tree cannot result in an enumeration
	if (target)
		doWorkForFindAll(roots,target,true); // find all matches recursively

	return roots;
}